

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O0

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::create_page(LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
              *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  progress_guarantee i_progress_guarantee_00;
  ControlBlock *i_atomic;
  bad_alloc *this_00;
  ControlBlock *local_38;
  ControlBlock *new_page_end_block;
  ControlBlock *new_page;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *this_local;
  
  if (i_progress_guarantee == LfQueue_Throwing) {
    local_38 = (ControlBlock *)
               basic_default_allocator<256UL>::allocate_page_zeroed
                         ((basic_default_allocator<256UL> *)this);
  }
  else {
    i_progress_guarantee_00 = ToDenGuarantee(i_progress_guarantee);
    local_38 = (ControlBlock *)
               basic_default_allocator<256UL>::try_allocate_page_zeroed
                         ((basic_default_allocator<256UL> *)this,i_progress_guarantee_00);
  }
  if (local_38 == (ControlBlock *)0x0) {
    if (i_progress_guarantee == LfQueue_Throwing) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else {
    i_atomic = LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<256UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
               ::get_end_control_block(local_38);
    raw_atomic_store(&i_atomic->m_next,8,memory_order_seq_cst);
  }
  return local_38;
}

Assistant:

ControlBlock * create_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                auto const new_page = static_cast<ControlBlock *>(
                  i_progress_guarantee == LfQueue_Throwing
                    ? ALLOCATOR_TYPE::allocate_page_zeroed()
                    : ALLOCATOR_TYPE::try_allocate_page_zeroed(
                        ToDenGuarantee(i_progress_guarantee)));
                if (new_page != nullptr)
                {
                    ControlBlock * const new_page_end_block = get_end_control_block(new_page);
                    raw_atomic_store(
                      &new_page_end_block->m_next, uintptr_t(LfQueue_InvalidNextPage));
                }
                else
                {
                    if (i_progress_guarantee == LfQueue_Throwing)
                    {
                        throw std::bad_alloc();
                    }
                }
                return new_page;
            }